

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

bgp_peer * get_peer_by_string(string *search)

{
  bool bVar1;
  reference pbVar2;
  char *__rhs;
  bgp_client_peer *peer;
  iterator __end1;
  iterator __begin1;
  vector<bgp_client_peer,_std::allocator<bgp_client_peer>_> *__range1;
  string *search_local;
  
  __end1 = std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>::begin(&peers);
  peer = (bgp_client_peer *)
         std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>::end(&peers);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<bgp_client_peer_*,_std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>_>
                                *)&peer);
    if (!bVar1) {
      return (bgp_peer *)0x0;
    }
    pbVar2 = __gnu_cxx::
             __normal_iterator<bgp_client_peer_*,_std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>_>
             ::operator*(&__end1);
    __rhs = inet_ntoa((in_addr)(pbVar2->server_address).sin_addr.s_addr);
    bVar1 = std::operator==(search,__rhs);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<bgp_client_peer_*,_std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>_>
    ::operator++(&__end1);
  }
  return &pbVar2->super_bgp_peer;
}

Assistant:

bgp_peer* get_peer_by_string(const std::string& search){
    for(auto & peer : peers){
        if(search == inet_ntoa(peer.server_address.sin_addr)){
            return &peer;
        }
    }
    return nullptr;
}